

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToLocalSB::map_utf8
          (CCharmapToLocalSB *this,char *dest,size_t dest_len,utf8_ptr src,size_t src_byte_len,
          size_t *src_bytes_used)

{
  uint *puVar1;
  uchar *puVar2;
  wchar_t wVar3;
  uint uVar4;
  utf8_ptr p;
  ulong __n;
  size_t sVar5;
  bool bVar6;
  
  sVar5 = 0;
  for (p.p_ = src.p_; p.p_ < src.p_ + src_byte_len; p.p_ = utf8_ptr::s_inc(p.p_)) {
    wVar3 = utf8_ptr::s_getch(p.p_);
    puVar1 = (this->super_CCharmapToLocal).map_[(uint)wVar3 >> 8 & 0xff];
    if (puVar1 == (uint *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = puVar1[(uint)(wVar3 & 0xff)];
    }
    puVar2 = (this->super_CCharmapToLocal).xlat_array_;
    __n = (ulong)puVar2[uVar4];
    if (dest == (char *)0x0) {
      dest = (char *)0x0;
    }
    else {
      bVar6 = dest_len < __n;
      dest_len = dest_len - __n;
      if (bVar6) break;
      memcpy(dest,puVar2 + (ulong)uVar4 + 1,__n);
      dest = dest + __n;
    }
    sVar5 = sVar5 + __n;
  }
  if (src_bytes_used != (size_t *)0x0) {
    *src_bytes_used = (long)p.p_ - (long)src.p_;
  }
  return sVar5;
}

Assistant:

size_t CCharmapToLocalSB::map_utf8(char *dest, size_t dest_len,
                                   utf8_ptr src, size_t src_byte_len,
                                   size_t *src_bytes_used) const
{
    /* remember where we started */
    utf8_ptr src_start = src;

    /* compute where the source buffer ends */
    char *srcend = src.getptr() + src_byte_len;

    /* copy characters until we reach the end of the source string */
    size_t cur_total;
    for (cur_total = 0 ; src.getptr() < srcend ; src.inc())
    {
        const unsigned char *mapping;
        size_t map_len;
        
        /* get the mapping for this character */
        mapping = get_xlation(src.getch(), &map_len);

        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest == 0)
        {
            /* we're just counting */
        }
        else if (map_len <= dest_len)
        {
            /* add the sequence */
            memcpy(dest, mapping, map_len);

            /* adjust the output pointer and length remaining */
            dest += map_len;
            dest_len -= map_len;
        }
        else
        {
            /* it doesn't fit - stop now */
            break;
        }

        /* count the length in the total */
        cur_total += map_len;
    }

    /* if the caller wants to know how much space we used, tell them */
    if (src_bytes_used != 0)
        *src_bytes_used = src.getptr() - src_start.getptr();

    /* return the total length of the result */
    return cur_total;
}